

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

string * __thiscall
flatbuffers::Parser::UnqualifiedName
          (string *__return_storage_ptr__,Parser *this,string *full_qualified_name)

{
  Namespace *pNVar1;
  value_type local_68;
  long local_48;
  size_t previous;
  size_t current;
  Namespace *local_28;
  Namespace *ns;
  string *full_qualified_name_local;
  Parser *this_local;
  
  ns = (Namespace *)full_qualified_name;
  full_qualified_name_local = (string *)this;
  this_local = (Parser *)__return_storage_ptr__;
  pNVar1 = (Namespace *)operator_new(0x20);
  Namespace::Namespace(pNVar1);
  local_48 = 0;
  local_28 = pNVar1;
  previous = std::__cxx11::string::find((char)ns,0x2e);
  while (pNVar1 = local_28, previous != 0xffffffffffffffff) {
    std::__cxx11::string::substr((ulong)&local_68,(ulong)ns);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&pNVar1->components,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    local_48 = previous + 1;
    previous = std::__cxx11::string::find((char)ns,0x2e);
  }
  pNVar1 = UniqueNamespace(this,local_28);
  this->current_namespace_ = pNVar1;
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)ns);
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::UnqualifiedName(const std::string &full_qualified_name) {
  Namespace *ns = new Namespace();

  std::size_t current, previous = 0;
  current = full_qualified_name.find('.');
  while (current != std::string::npos) {
    ns->components.push_back(
        full_qualified_name.substr(previous, current - previous));
    previous = current + 1;
    current = full_qualified_name.find('.', previous);
  }
  current_namespace_ = UniqueNamespace(ns);
  return full_qualified_name.substr(previous, current - previous);
}